

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ce9dfc::cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile
          (cmFindPackageCommandHoldFile *this)

{
  allocator<char> local_21;
  string local_20;
  
  if (this->File != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_20,this->File,&local_21);
    cmsys::SystemTools::RemoveFile(&local_20);
    std::__cxx11::string::~string((string *)&local_20);
  }
  return;
}

Assistant:

~cmFindPackageCommandHoldFile()
  {
    if (this->File) {
      cmSystemTools::RemoveFile(this->File);
    }
  }